

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,error_code *ec)

{
  pointer ppVar1;
  pointer ppVar2;
  uint8_t uVar3;
  assertion_error *this_00;
  value_type *pvVar4;
  ulong uVar5;
  value_type *__src;
  uint8_t type;
  string local_50;
  
  if (this->done_ == false) {
    do {
      if (this->more_ != true) {
        return;
      }
      ppVar1 = (this->state_stack_).
               super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      switch(ppVar1[-1].mode) {
      case root:
        ppVar1[-1].mode = accept;
        begin_document(this,visitor,ec);
        break;
      case accept:
        ppVar2 = (this->state_stack_).
                 super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)ppVar1 - (long)ppVar2 != 0x28) {
          this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"assertion \'state_stack_.size() == 1\' failed at  <> :0",
                     "");
          assertion_error::assertion_error(this_00,&local_50);
          __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (ppVar1 != ppVar2) {
          (this->state_stack_).
          super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
        }
        this->more_ = false;
        this->done_ = true;
        (*visitor->_vptr_basic_json_visitor[2])(visitor);
        break;
      case document:
        __src = (this->source_).current_;
        pvVar4 = (this->source_).end_;
        uVar5 = (ulong)(pvVar4 != __src);
        memcpy(&local_50,__src,uVar5);
        (this->source_).current_ = __src + uVar5;
        ppVar1[-1].pos = ppVar1[-1].pos + uVar5;
        if (pvVar4 == __src) {
LAB_0020a740:
          std::error_code::operator=(ec,unexpected_eof);
          this->more_ = false;
        }
        else {
          uVar3 = (uint8_t)local_50._M_dataplus._M_p;
          if ((uint8_t)local_50._M_dataplus._M_p == '\0') {
            end_document(this,visitor,ec);
          }
          else {
            read_e_name(this,visitor,document,ec);
            ppVar1 = (this->state_stack_).
                     super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            ppVar1[-1].mode = value;
            ppVar1[-1].type = uVar3;
          }
        }
        goto LAB_0020a6db;
      case array:
        __src = (this->source_).current_;
        pvVar4 = (this->source_).end_;
        uVar5 = (ulong)(pvVar4 != __src);
        memcpy(&local_50,__src,uVar5);
        (this->source_).current_ = __src + uVar5;
        ppVar1[-1].pos = ppVar1[-1].pos + uVar5;
        if (pvVar4 == __src) goto LAB_0020a740;
        uVar3 = (uint8_t)local_50._M_dataplus._M_p;
        if ((uint8_t)local_50._M_dataplus._M_p == '\0') {
          end_array(this,visitor,ec);
        }
        else {
          read_e_name(this,visitor,array,ec);
          read_value(this,visitor,uVar3,ec);
        }
LAB_0020a6db:
        if (pvVar4 == __src) {
          return;
        }
        break;
      case value:
        ppVar1[-1].mode = document;
        read_value(this,visitor,ppVar1[-1].type,ec);
      }
    } while (this->done_ != true);
  }
  return;
}

Assistant:

void parse(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(source_.is_error()))
        {
            ec = bson_errc::source_error;
            more_ = false;
            return;
        }
        
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::root:
                    state_stack_.back().mode = parse_mode::accept;
                    begin_document(visitor, ec);
                    break;
                case parse_mode::document:
                {
                    uint8_t type;
                    std::size_t n = source_.read(&type, 1);
                    state_stack_.back().pos += n;
                    if (JSONCONS_UNLIKELY(n != 1))
                    {
                        ec = bson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (type != 0x00)
                    {
                        read_e_name(visitor,jsoncons::bson::bson_container_type::document,ec);
                        state_stack_.back().mode = parse_mode::value;
                        state_stack_.back().type = type;
                    }
                    else
                    {
                        end_document(visitor,ec);
                    }
                    break;
                }
                case parse_mode::array:
                {
                    uint8_t type;
                    std::size_t n = source_.read(&type, 1);
                    state_stack_.back().pos += n;
                    if (JSONCONS_UNLIKELY(n != 1))
                    {
                        ec = bson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (type != 0x00)
                    {
                        read_e_name(visitor,jsoncons::bson::bson_container_type::array,ec);
                        read_value(visitor, type, ec);
                    }
                    else
                    {
                        end_array(visitor,ec);
                    }
                    break;
                }
                case parse_mode::value:
                    state_stack_.back().mode = parse_mode::document;
                    read_value(visitor,state_stack_.back().type,ec);
                    break;
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }